

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

string * basisu::string_get_extension(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  int iVar2;
  allocator<char> local_21;
  
  iVar1 = string_find_right(filename,'/');
  iVar2 = string_find_right(filename,'.');
  if (iVar1 < iVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)"",&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string string_get_extension(const std::string &filename)
	{
		int sep = -1;
#ifdef _WIN32
		sep = string_find_right(filename, '\\');
#endif
		if (sep < 0)
			sep = string_find_right(filename, '/');

		int dot = string_find_right(filename, '.');
		if (dot <= sep)
			return "";

		std::string result(filename);
		result.erase(0, dot + 1);

		return result;
	}